

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

void __thiscall xmrig::CpuBackend::handleRequest(CpuBackend *this,IApiRequest *request)

{
  int iVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  CpuBackendPrivate *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffe0;
  Document *in_stack_ffffffffffffffe8;
  
  iVar1 = (**(code **)((in_RSI->data_).n.i64 + 0x70))();
  if (iVar1 == 1) {
    (**(code **)((in_RSI->data_).n.i64 + 0x68))();
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>
              ((GenericStringRef<char> *)&stack0xffffffffffffffe0,(char (*) [10])"hugepages");
    (**(code **)((in_RSI->data_).n.i64 + 0x50))();
    (**(code **)((in_RSI->data_).n.i64 + 0x60))();
    CpuBackendPrivate::hugePages(in_RDI,(int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
    this_00 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               *)(**(code **)((in_RSI->data_).n.i64 + 0x60))();
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(this_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_RSI,(StringRefType *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
              (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffffd8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void xmrig::CpuBackend::handleRequest(IApiRequest &request)
{
    if (request.type() == IApiRequest::REQ_SUMMARY) {
        request.reply().AddMember("hugepages", d_ptr->hugePages(request.version(), request.doc()), request.doc().GetAllocator());
    }
}